

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O0

Value * __thiscall Json::Value::operator=(Value *this,Value *other)

{
  undefined1 local_30 [8];
  Value temp;
  Value *other_local;
  Value *this_local;
  
  temp.comments_ = (CommentInfo *)other;
  Value((Value *)local_30,other);
  swap(this,(Value *)local_30);
  ~Value((Value *)local_30);
  return this;
}

Assistant:

Value &
Value::operator=( const Value &other )
{
   Value temp( other );
   swap( temp );
   return *this;
}